

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus
calculateRowValuesQuad
          (HighsLp *lp,vector<double,_std::allocator<double>_> *col_value,
          vector<double,_std::allocator<double>_> *row_value,HighsInt report_row)

{
  size_type sVar1;
  const_reference pvVar2;
  uint *puVar3;
  const_reference pvVar4;
  reference this;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  uint in_ECX;
  vector<double,_std::allocator<double>_> *in_RSI;
  int *in_RDI;
  HighsInt row;
  HighsInt i;
  HighsInt col;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> row_value_quad;
  bool data_error;
  bool is_colwise;
  bool correct_size;
  size_type in_stack_ffffffffffffff28;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *this_00;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  uint uVar8;
  HighsCDouble *in_stack_ffffffffffffff40;
  value_type in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  byte local_91;
  int local_64;
  uint local_60;
  HighsCDouble local_50;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_40;
  byte local_27;
  undefined1 local_26;
  byte local_25;
  uint local_24;
  vector<double,_std::allocator<double>_> *local_18;
  int *local_10;
  HighsStatus local_4;
  
  local_24 = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  local_25 = (int)sVar1 == *local_10;
  local_26 = HighsSparseMatrix::isColwise((HighsSparseMatrix *)(local_10 + 0x20));
  local_91 = 1;
  if ((local_25 & 1) != 0) {
    local_91 = local_26 ^ 0xff;
  }
  local_27 = local_91 & 1;
  if (local_27 == 0) {
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x500a77);
    HighsCDouble::HighsCDouble(&local_50,0.0);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::assign
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(value_type *)0x500ab4);
    for (local_60 = 0; (int)local_60 < *local_10; local_60 = local_60 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)(int)local_60
                         );
      local_64 = *pvVar2;
      while( true ) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),
                            (long)(int)(local_60 + 1));
        if (*pvVar2 <= local_64) break;
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(local_10 + 0x30),
                                    (long)local_64);
        uVar8 = *puVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (local_18,(long)(int)local_60);
        in_stack_ffffffffffffff48 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36),
                            (long)local_64);
        in_stack_ffffffffffffff50 =
             (vector<double,_std::allocator<double>_> *)(in_stack_ffffffffffffff48 * *pvVar4);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&local_40,(long)(int)uVar8);
        HighsCDouble::operator+=
                  (in_stack_ffffffffffffff40,
                   (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if (uVar8 == local_24) {
          this = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                           (&local_40,(long)(int)uVar8);
          in_stack_ffffffffffffff40 = (HighsCDouble *)HighsCDouble::operator_cast_to_double(this);
          in_stack_ffffffffffffff38 = local_60;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_18,(long)(int)local_60);
          printf("calculateRowValuesQuad: Row %d becomes %g due to contribution of .col_value[%d] = %g\n"
                 ,in_stack_ffffffffffffff40,*pvVar4,(ulong)uVar8,(ulong)in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff3c = uVar8;
        }
        local_64 = local_64 + 1;
      }
    }
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    this_00 = &local_40;
    iVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::begin(this_00);
    iVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::end(this_00);
    iVar7 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)this_00);
    std::
    transform<__gnu_cxx::__normal_iterator<HighsCDouble*,std::vector<HighsCDouble,std::allocator<HighsCDouble>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,calculateRowValuesQuad(HighsLp_const&,std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&,int)::__0>
              (iVar5._M_current,iVar6._M_current,iVar7._M_current);
    local_4 = kOk;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_ffffffffffffff40);
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus calculateRowValuesQuad(const HighsLp& lp,
                                   const std::vector<double>& col_value,
                                   std::vector<double>& row_value,
                                   const HighsInt report_row) {
  const bool correct_size = int(col_value.size()) == lp.num_col_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> row_value_quad;
  row_value_quad.assign(lp.num_row_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      row_value_quad[row] += col_value[col] * lp.a_matrix_.value_[i];
      if (row == report_row) {
        printf(
            "calculateRowValuesQuad: Row %d becomes %g due to contribution of "
            ".col_value[%d] = %g\n",
            int(row), double(row_value_quad[row]), int(col), col_value[col]);
      }
    }
  }

  // assign quad values to double vector
  row_value.resize(lp.num_row_);
  std::transform(row_value_quad.begin(), row_value_quad.end(),
                 row_value.begin(), [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}